

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_chroma_intra_pred_filters.c
# Opt level: O0

void ihevc_intra_pred_chroma_mode_27_to_33
               (UWORD8 *pu1_ref,WORD32 src_strd,UWORD8 *pu1_dst,WORD32 dst_strd,WORD32 nt,
               WORD32 mode)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  WORD32 ref_main_idx_v;
  WORD32 ref_main_idx_u;
  WORD32 idx;
  WORD32 intra_pred_ang;
  WORD32 fract;
  WORD32 pos;
  WORD32 col;
  WORD32 row;
  WORD32 mode_local;
  WORD32 nt_local;
  WORD32 dst_strd_local;
  UWORD8 *pu1_dst_local;
  WORD32 src_strd_local;
  UWORD8 *pu1_ref_local;
  
  iVar1 = gai4_ihevc_ang_table_chroma[mode];
  for (row = 0; row < nt; row = row + 1) {
    uVar2 = (row + 1) * iVar1;
    iVar3 = (int)uVar2 >> 5;
    uVar2 = uVar2 & 0x1f;
    for (col = 0; SBORROW4(col,nt * 2) != col + nt * -2 < 0; col = col + 2) {
      iVar4 = nt * 4 + col + iVar3 * 2;
      iVar5 = nt * 4 + col + iVar3 * 2;
      pu1_dst[col + row * dst_strd] =
           (UWORD8)((int)((0x20 - uVar2) * (uint)pu1_ref[iVar4 + 2] + uVar2 * pu1_ref[iVar4 + 4] +
                         0x10) >> 5);
      pu1_dst[col + 1 + row * dst_strd] =
           (UWORD8)((int)((0x20 - uVar2) * (uint)pu1_ref[iVar5 + 3] + uVar2 * pu1_ref[iVar5 + 5] +
                         0x10) >> 5);
    }
  }
  return;
}

Assistant:

void ihevc_intra_pred_chroma_mode_27_to_33(UWORD8 *pu1_ref,
                                           WORD32 src_strd,
                                           UWORD8 *pu1_dst,
                                           WORD32 dst_strd,
                                           WORD32 nt,
                                           WORD32 mode)
{
    WORD32 row, col;
    WORD32 pos, fract;
    WORD32 intra_pred_ang;
    WORD32 idx, ref_main_idx_u, ref_main_idx_v;
    UNUSED(src_strd);


    intra_pred_ang = gai4_ihevc_ang_table_chroma[mode];

    for(row = 0; row < nt; row++)
    {
        pos = ((row + 1) * intra_pred_ang);
        idx = pos >> 5;
        fract = pos & (31);


        // Do linear filtering
        for(col = 0; col < (2 * nt); col += 2)
        {
            ref_main_idx_u = (4 * nt) + col + 2 * idx + 2;
            ref_main_idx_v = (4 * nt) + (col + 1) + 2 * idx + 2;
            pu1_dst[col + (row * dst_strd)] = (((32 - fract)
                            * pu1_ref[ref_main_idx_u]
                            + fract * pu1_ref[ref_main_idx_u + 2] + 16) >> 5);
            pu1_dst[(col + 1) + (row * dst_strd)] = (((32 - fract)
                            * pu1_ref[ref_main_idx_v]
                            + fract * pu1_ref[ref_main_idx_v + 2] + 16) >> 5);

        }
    }

}